

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::OnlyOneGroup,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addCommandWithDefaultValues<char_const(&)[9]>
          (API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,char (*name) [9],ValueOptions opt,bool isSubCommandRequired,String *desc,
          String *longDesc,StringList *defaultValues,String *valueSpecifier)

{
  bool bVar1;
  ulong uVar2;
  GroupIface *in_RSI;
  API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  byte in_R8B;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> arg;
  Command *c;
  unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> cmd;
  bool in_stack_000000e3;
  ValueOptions in_stack_000000e4;
  char (*in_stack_000000e8) [9];
  Command *in_stack_000000f0;
  pointer in_stack_ffffffffffffff48;
  Command *in_stack_ffffffffffffff50;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *arg_00;
  unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> local_60;
  type local_50;
  Deleter<Args::ArgIface> local_45 [13];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_38;
  byte local_1d;
  
  local_1d = in_R8B & 1;
  arg_00 = in_RDI;
  operator_new(0xf0);
  Command::Command<char_const(&)[9]>
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e3);
  Deleter<Args::ArgIface>::Deleter(local_45,true);
  std::unique_ptr<Args::Command,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x17a918);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x17a936);
    Command::setDescription(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x17a99d);
    Command::setLongDescription(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffff60);
  if (!bVar1) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x17a9cf);
    Command::setDefaultValues(in_stack_ffffffffffffff50,(StringList *)in_stack_ffffffffffffff48);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)0x17aa01);
    Command::setValueSpecifier(in_stack_ffffffffffffff50,(String *)in_stack_ffffffffffffff48);
  }
  this_00 = &local_38;
  local_50 = std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::operator*
                       ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)
                        this_00);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::Command,Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff60,&local_60);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            (this_00,(unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                     in_stack_ffffffffffffff48);
  GroupIface::addArg(in_RSI,(ArgPtr *)arg_00);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  API<Args::details::API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  ::API(in_RDI,(API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
                *)in_RSI,local_50);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  std::unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::Command,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return arg_00;
}

Assistant:

API< API< PARENT, SELF, ARGPTR, false >, Command, ARGPTR, false > addCommandWithDefaultValues(
		//! Name of the group.
		NAME && name,
		//! Value type.
		ValueOptions opt = ValueOptions::NoValue,
		//! Is sub-command required?
		bool isSubCommandRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const StringList & defaultValues = StringList(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{
		auto cmd = std::unique_ptr< Command, details::Deleter< ArgIface > > (
			new Command( std::forward< NAME > ( name ), opt, isSubCommandRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			cmd->setDescription( desc );

		if( !longDesc.empty() )
			cmd->setLongDescription( longDesc );

		if( !defaultValues.empty() )
			cmd->setDefaultValues( defaultValues );

		if( !valueSpecifier.empty() )
			cmd->setValueSpecifier( valueSpecifier );

		Command & c = *cmd;

		ARGPTR arg = std::move( cmd );

		m_self.addArg( std::move( arg ) );

		return API< API< PARENT, SELF, ARGPTR, false >, Command, ARGPTR, false > ( *this, c );
	}